

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O2

AnalyzedReferences * __thiscall
jaegertracing::Tracer::analyzeReferences
          (AnalyzedReferences *__return_storage_ptr__,Tracer *this,
          vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
          *references)

{
  Type TVar1;
  element_type *peVar2;
  bool bVar3;
  SpanContext *pSVar4;
  bool bVar5;
  bool bVar6;
  SpanContext *pSVar7;
  Type *pTVar8;
  allocator local_111;
  SpanContext *local_110;
  AnalyzedReferences *local_108;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *local_100;
  Tracer *local_f8;
  Type *local_f0;
  Reference local_e8;
  
  (__return_storage_ptr__->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->_parent = (SpanContext *)0x0;
  __return_storage_ptr__->_self = (SpanContext *)0x0;
  local_100 = &__return_storage_ptr__->_references;
  pTVar8 = *(Type **)references;
  local_f0 = *(Type **)(references + 8);
  local_110 = (SpanContext *)0x0;
  bVar3 = false;
  local_108 = __return_storage_ptr__;
  local_f8 = this;
  for (; pSVar7 = local_110, pTVar8 != local_f0; pTVar8 = pTVar8 + 4) {
    bVar6 = bVar3;
    if ((*(undefined8 *)(pTVar8 + 2) == 0) ||
       (pSVar7 = (SpanContext *)
                 __dynamic_cast(*(undefined8 *)(pTVar8 + 2),&opentracing::v3::SpanContext::typeinfo,
                                &SpanContext::typeinfo,0), pSVar7 == (SpanContext *)0x0)) {
      peVar2 = (local_f8->_logger).
               super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::__cxx11::string::string
                ((string *)&local_e8,"Reference contains invalid type of SpanReference",&local_111);
      (*peVar2->_vptr_Logger[2])(peVar2,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      pSVar4 = local_110;
    }
    else {
      bVar5 = SpanContext::isValid(pSVar7);
      if (((bVar5) || (bVar5 = SpanContext::isDebugIDContainerOnly(pSVar7), bVar5)) ||
         (pSVar4 = local_110, (pSVar7->_baggage)._M_h._M_element_count != 0)) {
        TVar1 = *pTVar8;
        if (TVar1 == 99) {
          local_108->_self = pSVar7;
          pSVar4 = local_110;
        }
        else {
          SpanContext::SpanContext(&local_e8._spanContext,pSVar7);
          local_e8._type = TVar1;
          std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::
          emplace_back<jaegertracing::Reference>(local_100,&local_e8);
          SpanContext::~SpanContext(&local_e8._spanContext);
          pSVar4 = pSVar7;
          bVar6 = *pTVar8 == ChildOfRef;
          if (bVar3) {
            pSVar4 = local_110;
            bVar6 = bVar3;
          }
        }
      }
    }
    bVar3 = bVar6;
    local_110 = pSVar4;
  }
  if (((!bVar3) && (local_110 != (SpanContext *)0x0)) &&
     (bVar6 = SpanContext::isValid(local_110), bVar6)) {
    bVar3 = true;
  }
  if (bVar3) {
    if (pSVar7 == (SpanContext *)0x0) {
      __assert_fail("parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/Tracer.cpp"
                    ,0xef,
                    "Tracer::AnalyzedReferences jaegertracing::Tracer::analyzeReferences(const std::vector<OpenTracingRef> &) const"
                   );
    }
    local_108->_parent = pSVar7;
  }
  return local_108;
}

Assistant:

Tracer::AnalyzedReferences
Tracer::analyzeReferences(const std::vector<OpenTracingRef>& references) const
{
    AnalyzedReferences result;
    auto hasParent = false;
    const auto* parent = result._parent;
    for (auto&& ref : references) {
        const auto* ctx = dynamic_cast<const SpanContext*>(ref.second);

        if (!ctx) {
            _logger->error("Reference contains invalid type of SpanReference");
            continue;
        }

        if (!ctx->isValid() && !ctx->isDebugIDContainerOnly() &&
            ctx->baggage().empty()) {
            continue;
        }

        if (static_cast<int>(ref.first) == SpanReferenceType_JaegerSpecific_SelfRef)
        {
            result._self = ctx;
            continue; // not a reference
        }

        result._references.emplace_back(Reference(*ctx, ref.first));

        if (!hasParent) {
            parent = ctx;
            hasParent =
                (ref.first == opentracing::SpanReferenceType::ChildOfRef);
        }
    }

    if (!hasParent && parent && parent->isValid()) {
        // Use `FollowsFromRef` in place of `ChildOfRef`.
        hasParent = true;
    }

    if (hasParent) {
        assert(parent);
        result._parent = parent;
    }

    return result;
}